

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_EmptyContextErrorTest_Test::TestBody(Secp256k1_EmptyContextErrorTest_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  initializer_list<cfd::core::ByteData> __l;
  ByteData actual;
  Secp256k1 secp;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_vector;
  long alStack_d0 [2];
  allocator_type local_b9;
  ByteData local_b8;
  ByteData local_a0;
  string local_88;
  Secp256k1 local_68;
  string local_60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_40;
  
  alStack_d0[0] = 0x3f7605;
  cfd::core::Secp256k1::Secp256k1(&local_68,(void *)0x0);
  alStack_d0[0] = 0x3f7626;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9","");
  alStack_d0[0] = 0x3f7638;
  cfd::core::ByteData::ByteData(&local_b8,&local_88);
  alStack_d0[0] = 0x3f765f;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe","");
  alStack_d0[0] = 0x3f766c;
  cfd::core::ByteData::ByteData(&local_a0,&local_60);
  alStack_d0[0] = 0x3f7688;
  __l._M_len = 2;
  __l._M_array = &local_b8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_40,__l,&local_b9);
  lVar3 = 0x30;
  do {
    pvVar1 = *(void **)((long)alStack_d0 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_d0[0] = 0x3f76a4;
      operator_delete(pvVar1,*(long *)(&stack0xffffffffffffff40 + lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    alStack_d0[0] = 0x3f76c1;
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    alStack_d0[0] = 0x3f76d8;
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  alStack_d0[0] = 0x3f76dd;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    alStack_d0[0] = 0x3f76ff;
    cfd::core::Secp256k1::CombinePubkeySecp256k1Ec(&local_b8,&local_68,&local_40);
    if ((long *)local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      alStack_d0[0] = 0x3f7716;
      operator_delete(local_b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  alStack_d0[0] = 0x3f7726;
  testing::Message::Message((Message *)&local_b8);
  alStack_d0[0] = 0x3f7744;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
             ,0x93,
             "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  alStack_d0[0] = 0x3f7753;
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_b8);
  alStack_d0[0] = 0x3f775d;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
  if ((long *)local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    alStack_d0[0] = 0x3f776f;
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
      alStack_d0[0] = 0x3f7783;
      (**(code **)(*(long *)local_b8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  alStack_d0[0] = 0x3f7799;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_40);
  return;
}

Assistant:

TEST(Secp256k1, EmptyContextErrorTest) {
  struct secp256k1_context_struct *cxt = nullptr;
  Secp256k1 secp = Secp256k1(cxt);

  std::vector<ByteData> test_vector =
      { ByteData(
          "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"),
          ByteData(
              "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe") };
  EXPECT_THROW(ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector),
               CfdException);
}